

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall OpenMD::Atom::getGrad(Atom *this)

{
  double *pdVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  Vector3d force;
  vector<double,_std::allocator<double>_> *grad;
  StuntDouble *in_stack_ffffffffffffff48;
  value_type_conflict2 *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  Vector<double,_3U> local_50 [2];
  undefined8 local_20;
  undefined1 local_11;
  
  local_11 = 0;
  local_20 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x2bf007);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (allocator_type *)in_stack_ffffffffffffff48);
  std::allocator<double>::~allocator((allocator<double> *)0x2bf032);
  StuntDouble::getFrc(in_stack_ffffffffffffff48);
  pdVar1 = Vector<double,_3U>::operator[](local_50,0);
  dVar3 = *pdVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  *pvVar2 = -dVar3;
  pdVar1 = Vector<double,_3U>::operator[](local_50,1);
  dVar3 = -*pdVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  *pvVar2 = dVar3;
  pdVar1 = Vector<double,_3U>::operator[](local_50,2);
  dVar3 = *pdVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  *pvVar2 = -dVar3;
  return in_RDI;
}

Assistant:

std::vector<RealType> Atom::getGrad() {
    std::vector<RealType> grad(3, 0.0);

    Vector3d force = getFrc();

    grad[0] = -force[0];
    grad[1] = -force[1];
    grad[2] = -force[2];

    return grad;
  }